

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

char * gl4cts::anon_unknown_0::GetInput140c3
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data)

{
  reference pvVar1;
  float *fp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data,0x80);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_data,0);
  pvVar1[0] = '\0';
  pvVar1[1] = '\0';
  pvVar1[2] = 0x80;
  pvVar1[3] = '?';
  pvVar1[4] = '\0';
  pvVar1[5] = '\0';
  pvVar1[6] = '\0';
  pvVar1[7] = '\0';
  pvVar1[8] = '\0';
  pvVar1[9] = '\0';
  pvVar1[10] = '\0';
  pvVar1[0xb] = '\0';
  pvVar1[0xc] = '\0';
  pvVar1[0xd] = '\0';
  pvVar1[0xe] = '\0';
  pvVar1[0xf] = '\0';
  pvVar1[0x10] = '\0';
  pvVar1[0x11] = '\0';
  pvVar1[0x12] = '\0';
  pvVar1[0x13] = '@';
  pvVar1[0x14] = '\0';
  pvVar1[0x15] = '\0';
  pvVar1[0x16] = '\0';
  pvVar1[0x17] = '\0';
  pvVar1[0x18] = '\0';
  pvVar1[0x19] = '\0';
  pvVar1[0x1a] = '\0';
  pvVar1[0x1b] = '\0';
  pvVar1[0x1c] = '\0';
  pvVar1[0x1d] = '\0';
  pvVar1[0x1e] = '\0';
  pvVar1[0x1f] = '\0';
  pvVar1[0x20] = '\0';
  pvVar1[0x21] = '\0';
  pvVar1[0x22] = '@';
  pvVar1[0x23] = '@';
  pvVar1[0x24] = '\0';
  pvVar1[0x25] = '\0';
  pvVar1[0x26] = '\0';
  pvVar1[0x27] = '\0';
  pvVar1[0x28] = '\0';
  pvVar1[0x29] = '\0';
  pvVar1[0x2a] = '\0';
  pvVar1[0x2b] = '\0';
  pvVar1[0x2c] = '\0';
  pvVar1[0x2d] = '\0';
  pvVar1[0x2e] = '\0';
  pvVar1[0x2f] = '\0';
  pvVar1[0x30] = '\0';
  pvVar1[0x31] = '\0';
  pvVar1[0x32] = 0x80;
  pvVar1[0x33] = '@';
  pvVar1[0x34] = '\0';
  pvVar1[0x35] = '\0';
  pvVar1[0x36] = '\0';
  pvVar1[0x37] = '\0';
  pvVar1[0x38] = '\0';
  pvVar1[0x39] = '\0';
  pvVar1[0x3a] = '\0';
  pvVar1[0x3b] = '\0';
  pvVar1[0x3c] = '\0';
  pvVar1[0x3d] = '\0';
  pvVar1[0x3e] = '\0';
  pvVar1[0x3f] = '\0';
  pvVar1[0x40] = '\0';
  pvVar1[0x41] = '\0';
  pvVar1[0x42] = 0xa0;
  pvVar1[0x43] = '@';
  pvVar1[0x44] = '\0';
  pvVar1[0x45] = '\0';
  pvVar1[0x46] = 0xc0;
  pvVar1[0x47] = '@';
  pvVar1[0x48] = '\0';
  pvVar1[0x49] = '\0';
  pvVar1[0x4a] = '\0';
  pvVar1[0x4b] = '\0';
  pvVar1[0x4c] = '\0';
  pvVar1[0x4d] = '\0';
  pvVar1[0x4e] = '\0';
  pvVar1[0x4f] = '\0';
  pvVar1[0x50] = '\0';
  pvVar1[0x51] = '\0';
  pvVar1[0x52] = 0xe0;
  pvVar1[0x53] = '@';
  pvVar1[0x54] = '\0';
  pvVar1[0x55] = '\0';
  pvVar1[0x56] = '\0';
  pvVar1[0x57] = 'A';
  pvVar1[0x58] = '\0';
  pvVar1[0x59] = '\0';
  pvVar1[0x5a] = '\x10';
  pvVar1[0x5b] = 'A';
  pvVar1[0x5c] = '\0';
  pvVar1[0x5d] = '\0';
  pvVar1[0x5e] = '\0';
  pvVar1[0x5f] = '\0';
  pvVar1[0x60] = '\0';
  pvVar1[0x61] = '\0';
  pvVar1[0x62] = ' ';
  pvVar1[99] = 'A';
  pvVar1[100] = '\0';
  pvVar1[0x65] = '\0';
  pvVar1[0x66] = '0';
  pvVar1[0x67] = 'A';
  pvVar1[0x68] = '\0';
  pvVar1[0x69] = '\0';
  pvVar1[0x6a] = '@';
  pvVar1[0x6b] = 'A';
  pvVar1[0x6c] = '\0';
  pvVar1[0x6d] = '\0';
  pvVar1[0x6e] = '\0';
  pvVar1[0x6f] = '\0';
  pvVar1[0x70] = '\0';
  pvVar1[0x71] = '\0';
  pvVar1[0x72] = 'P';
  pvVar1[0x73] = 'A';
  return 
  "\nlayout(std140, binding = 0) buffer Input {\n  float data0;\n  float data1[3];\n  vec2 data2;\n  readonly vec3 data3[2];\n  float data4;\n} g_input;\nlayout(std140, binding = 1) buffer Output {\n  float data0;\n  float data1[3];\n  vec2 data2;\n  vec3 data3[2];\n  float data4;\n} g_output;\nvoid main() {\n  g_output.data0 = g_input.data0;\n  for (int i = 0; i < g_input.data1.length(); ++i) g_output.data1[i] = g_input.data1[i];\n  g_output.data2 = g_input.data2;\n  for (int i = 0; i < g_input.data3.length(); ++i) g_output.data3[i] = g_input.data3[i];\n  g_output.data4 = g_input.data4;\n}"
  ;
}

Assistant:

const char* GetInput140c3(std::vector<GLubyte>& in_data)
{
	in_data.resize(32 * 4);
	float* fp = reinterpret_cast<float*>(&in_data[0]);
	fp[0]	 = 1.0f;
	fp[1]	 = 0.0f;
	fp[2]	 = 0.0f;
	fp[3]	 = 0.0f;
	fp[4]	 = 2.0f;
	fp[5]	 = 0.0f;
	fp[6]	 = 0.0f;
	fp[7]	 = 0.0f;
	fp[8]	 = 3.0f;
	fp[9]	 = 0.0f;
	fp[10]	= 0.0f;
	fp[11]	= 0.0f;
	fp[12]	= 4.0f;
	fp[13]	= 0.0f;
	fp[14]	= 0.0f;
	fp[15]	= 0.0f;
	fp[16]	= 5.0f;
	fp[17]	= 6.0f;
	fp[18]	= 0.0f;
	fp[19]	= 0.0f;
	fp[20]	= 7.0f;
	fp[21]	= 8.0f;
	fp[22]	= 9.0f;
	fp[23]	= 0.0f;
	fp[24]	= 10.0f;
	fp[25]	= 11.0f;
	fp[26]	= 12.0f;
	fp[27]	= 0.0f;
	fp[28]	= 13.0f;

	return NL "layout(std140, binding = 0) buffer Input {" NL "  float data0;" NL "  float data1[3];" NL
			  "  vec2 data2;" NL "  readonly vec3 data3[2];" NL "  float data4;" NL "} g_input;" NL
			  "layout(std140, binding = 1) buffer Output {" NL "  float data0;" NL "  float data1[3];" NL
			  "  vec2 data2;" NL "  vec3 data3[2];" NL "  float data4;" NL "} g_output;" NL "void main() {" NL
			  "  g_output.data0 = g_input.data0;" NL
			  "  for (int i = 0; i < g_input.data1.length(); ++i) g_output.data1[i] = g_input.data1[i];" NL
			  "  g_output.data2 = g_input.data2;" NL
			  "  for (int i = 0; i < g_input.data3.length(); ++i) g_output.data3[i] = g_input.data3[i];" NL
			  "  g_output.data4 = g_input.data4;" NL "}";
}